

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O1

pboolean p_socket_close(PSocket *socket,PError **error)

{
  pint pVar1;
  
  if (socket == (PSocket *)0x0) {
    p_socket_close_cold_2();
  }
  else {
    if ((socket->field_0x18 & 4) != 0) {
      return 1;
    }
    pVar1 = p_sys_close(socket->fd);
    if (pVar1 == 0) {
      socket->field_0x18 = socket->field_0x18 & 0xe3 | 4;
      socket->fd = -1;
      return 1;
    }
    p_socket_close_cold_1();
  }
  return 0;
}

Assistant:

P_LIB_API pboolean
p_socket_close (PSocket	*socket,
		PError	**error)
{
	pint err_code;

	if (P_UNLIKELY (socket == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	if (socket->closed)
		return TRUE;

	if (P_LIKELY (p_sys_close (socket->fd) == 0)) {
		socket->connected = FALSE;
		socket->closed    = TRUE;
		socket->listening = FALSE;
		socket->fd        = -1;

		return TRUE;
	} else {
		err_code = p_error_get_last_net ();

		p_error_set_error_p (error,
				     (pint) p_error_get_io_from_system (err_code),
				     err_code,
				     "Failed to close socket");

		return FALSE;
	}
}